

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.cpp
# Opt level: O0

void crnlib::utils::copy_words(uint16 *pDst,uint16 *pSrc,uint num,bool endian_switch)

{
  byte in_CL;
  uint in_EDX;
  ushort *in_RSI;
  ushort *in_RDI;
  uint16 *pDst_end;
  ushort *local_18;
  ushort *local_10;
  
  if ((in_CL & 1) == 0) {
    memcpy(in_RDI,in_RSI,(ulong)(in_EDX << 1));
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    while (local_10 != in_RDI + in_EDX) {
      *local_10 = *local_18 << 8 | *local_18 >> 8;
      local_18 = local_18 + 1;
      local_10 = local_10 + 1;
    }
  }
  return;
}

Assistant:

void copy_words(uint16* pDst, const uint16* pSrc, uint num, bool endian_switch) {
  if (!endian_switch)
    memcpy(pDst, pSrc, num << 1U);
  else {
    uint16* pDst_end = pDst + num;
    while (pDst != pDst_end)
      *pDst++ = swap16(*pSrc++);
  }
}